

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall SimpleASTNode::print(SimpleASTNode *this,int level)

{
  bool bVar1;
  ostream *poVar2;
  __shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  shared_ptr<SimpleASTNode> *item;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_> *__range1;
  string local_38 [32];
  int local_18;
  int local_14;
  int i;
  int level_local;
  SimpleASTNode *this_local;
  
  local_14 = level;
  _i = this;
  if (level == 0) {
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    std::operator<<((ostream *)&std::cout,'\t');
  }
  syntaxType_abi_cxx11_((ASTNodeType *)local_38);
  poVar2 = std::operator<<((ostream *)&std::cout,local_38);
  poVar2 = std::operator<<(poVar2," : ");
  poVar2 = std::operator<<(poVar2,(string *)&this->m_text);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  __end1 = std::__cxx11::
           list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
           begin(&this->m_childList);
  item = (shared_ptr<SimpleASTNode> *)
         std::__cxx11::
         list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::end
                   (&this->m_childList);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&item);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::_List_iterator<std::shared_ptr<SimpleASTNode>_>::operator*(&__end1);
    this_01 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    print(this_01,local_14 + 1);
    std::_List_iterator<std::shared_ptr<SimpleASTNode>_>::operator++(&__end1);
  }
  return;
}

Assistant:

void SimpleASTNode::print(int level)
{
    if (!level)
        std::cout << std::endl;
    for (int i = 0; i < level; i++)
        std::cout << '\t';
    std::cout << syntaxType(m_type) << " : " << m_text << std::endl;
    for (auto& item : m_childList) {
        item->print(level + 1);
    }
}